

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

unsigned_short flatbuffers::JsonPrinter::GetFieldDefault<unsigned_short>(FieldDef *fd)

{
  undefined1 extraout_AL;
  bool bVar1;
  undefined1 extraout_AH;
  undefined6 extraout_var;
  unsigned_short local_12;
  bool check;
  FieldDef *pFStack_10;
  unsigned_short val;
  FieldDef *fd_local;
  
  local_12 = 0;
  pFStack_10 = fd;
  std::__cxx11::string::c_str();
  bVar1 = StringToNumber<unsigned_short>
                    ((char *)CONCAT62(extraout_var,CONCAT11(extraout_AH,extraout_AL)),&local_12);
  if (bVar1) {
    return local_12;
  }
  __assert_fail("check",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_text.cpp"
                ,0xfb,
                "static T flatbuffers::JsonPrinter::GetFieldDefault(const FieldDef &) [T = unsigned short]"
               );
}

Assistant:

static T GetFieldDefault(const FieldDef &fd) {
    T val{};
    auto check = StringToNumber(fd.value.constant.c_str(), &val);
    (void)check;
    FLATBUFFERS_ASSERT(check);
    return val;
  }